

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c633::TextureWriterTestHelper<unsigned_char,_4U,_32856U>::TextureWriterTestHelper
          (TextureWriterTestHelper<unsigned_char,_4U,_32856U> *this)

{
  long in_RDI;
  
  WriterTestHelper<unsigned_char,_4U,_32856U>::WriterTestHelper
            (&this->super_WriterTestHelper<unsigned_char,_4U,_32856U>);
  createInfo::createInfo((createInfo *)(in_RDI + 0x140));
  return;
}

Assistant:

TextureWriterTestHelper() {}